

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * utils::format<int>(string *__return_storage_ptr__,int *value)

{
  int iVar1;
  locale local_1b8 [8];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [392];
  int *local_18;
  int *value_local;
  
  local_18 = value;
  value_local = (int *)__return_storage_ptr__;
  if (format<int>(int_const&)::loc == '\0') {
    iVar1 = __cxa_guard_acquire(&format<int>(int_const&)::loc);
    if (iVar1 != 0) {
      std::locale::locale((locale *)&format<int>(int_const&)::loc,"");
      __cxa_atexit(std::locale::~locale,&format<int>(int_const&)::loc,&__dso_handle);
      __cxa_guard_release(&format<int>(int_const&)::loc);
    }
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ios::imbue(local_1b8);
  std::locale::~locale(local_1b8);
  std::ostream::operator<<(local_1a0,*local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format(const T &value)
    {
        static std::locale loc("");
        std::stringstream ss;
        ss.imbue(loc);
        ss << value;
        return ss.str();
    }